

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_unmark_geom_support(REF_SUBDIV ref_subdiv)

{
  REF_EDGE ref_edge;
  uint uVar1;
  ulong in_RAX;
  long lVar2;
  REF_INT nmark;
  REF_BOOL needs_support;
  undefined8 local_38;
  
  ref_edge = ref_subdiv->edge;
  local_38 = in_RAX;
  uVar1 = ref_edge_ghost_int(ref_edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar1 == 0) {
    if (0 < ref_edge->n) {
      lVar2 = 0;
      do {
        if (ref_subdiv->mark[lVar2] != 0) {
          uVar1 = ref_geom_support_between
                            (ref_subdiv->grid,ref_edge->e2n[lVar2 * 2],ref_edge->e2n[lVar2 * 2 + 1],
                             (REF_BOOL *)((long)&local_38 + 4));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x368,"ref_subdiv_unmark_geom_support",(ulong)uVar1,"support check");
            return uVar1;
          }
          if (local_38._4_4_ != 0) {
            ref_subdiv->mark[lVar2] = 0;
          }
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < ref_edge->n);
    }
    uVar1 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
    if (uVar1 == 0) {
      uVar1 = 0;
      if (ref_subdiv->instrument != 0) {
        uVar1 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_38);
        if (uVar1 == 0) {
          uVar1 = 0;
          if (ref_subdiv->grid->mpi->id == 0) {
            printf(" %d edges marked without geom support\n",local_38 & 0xffffffff);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x374,"ref_subdiv_unmark_geom_support",(ulong)uVar1,"count");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x370,"ref_subdiv_unmark_geom_support",(ulong)uVar1,"ghost mark");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x361,
           "ref_subdiv_unmark_geom_support",(ulong)uVar1,"ghost mark");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_geom_support(
    REF_SUBDIV ref_subdiv) {
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_INT edge;
  REF_BOOL needs_support;

  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge)) {
      RSS(ref_geom_support_between(
              ref_subdiv_grid(ref_subdiv), ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), &needs_support),
          "support check");
      if (needs_support) ref_subdiv_mark(ref_subdiv, edge) = 0;
    }
  }

  /* not be required but here for safety? */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  if (ref_subdiv->instrument) {
    REF_INT nmark;
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked without geom support\n", nmark);
  }

  return REF_SUCCESS;
}